

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall asmjit::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  BaseBuilder *pBVar7;
  BaseNode *pBVar8;
  long *plVar9;
  _func_int *p_Var10;
  byte *pbVar11;
  BaseNode *pBVar12;
  uint uVar13;
  Error EVar14;
  undefined4 uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  bool bVar20;
  undefined4 local_40;
  uint32_t local_3c;
  undefined8 local_38;
  
  if (first != stop) {
    pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
    uVar4._0_1_ = pBVar7[1].super_BaseEmitter._environment._arch;
    uVar4._1_1_ = pBVar7[1].super_BaseEmitter._environment._subArch;
    uVar4._2_1_ = pBVar7[1].super_BaseEmitter._environment._vendor;
    uVar4._3_1_ = pBVar7[1].super_BaseEmitter._environment._platform;
    do {
      pBVar8 = (first->field_0).field_0._next;
      if (((first->field_1)._any._nodeFlags & 0x20) != 0) {
        plVar9 = (long *)first->_passData;
        bVar2 = (first->field_1)._any._reserved0;
        if (plVar9 != (long *)0x0) {
          uVar5 = *(uint *)((long)plVar9 + 0xc);
          if ((ulong)uVar5 != 0) {
            uVar18 = 0;
            uVar17 = 0;
            do {
              uVar19 = *(uint *)((long)plVar9 + uVar18 * 0x18 + 0x54);
              if (uVar19 != 0) {
                bVar3 = *(byte *)((long)plVar9 + uVar18 * 0x18 + 0x5d);
                do {
                  if (uVar17 <= bVar3) {
                    uVar17 = (uint)bVar3;
                  }
                  uVar13 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  *(uint *)((long)&first[1].field_0 + (ulong)uVar13 * 4 + 0xc) = (uint)bVar3;
                  bVar20 = 1 << ((byte)uVar13 & 0x1f) != uVar19;
                  uVar19 = uVar19 ^ 1 << (uVar13 & 0x1f);
                } while (bVar20);
              }
              if (*(uint *)(plVar9 + uVar18 * 3 + 0xb) != 0) {
                bVar3 = *(byte *)((long)plVar9 + uVar18 * 0x18 + 0x5e);
                uVar19 = *(uint *)(plVar9 + uVar18 * 3 + 0xb);
                do {
                  if (uVar17 <= bVar3) {
                    uVar17 = (uint)bVar3;
                  }
                  uVar13 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  *(uint *)((long)&first[1].field_0 + (ulong)uVar13 * 4 + 0xc) = (uint)bVar3;
                  bVar20 = 1 << ((byte)uVar13 & 0x1f) != uVar19;
                  uVar19 = uVar19 ^ 1 << (uVar13 & 0x1f);
                } while (bVar20);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar5);
            if (((int)plVar9[1] < 0) && (0xf < uVar17)) {
              iVar6 = *(int *)&first[1].field_0;
              if (iVar6 < 0x42e) {
                if (iVar6 < 0x38f) {
                  if (iVar6 == 0x33a) {
                    uVar15 = 0x33c;
                  }
                  else if (iVar6 == 0x340) {
                    uVar15 = 0x342;
                  }
                  else {
                    if (iVar6 != 0x38a) {
LAB_00132a48:
                      DebugUtils::assertionFailed
                                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/x86/x86rapass.cpp"
                                 ,0x4bc,"false");
                    }
                    uVar15 = 0x38b;
                  }
                }
                else if (iVar6 == 0x38f) {
                  uVar15 = 0x390;
                }
                else if (iVar6 == 0x40c) {
                  uVar15 = 0x40d;
                }
                else {
                  if (iVar6 != 0x411) goto LAB_00132a48;
                  uVar15 = 0x412;
                }
              }
              else if (iVar6 < 0x46f) {
                if (iVar6 == 0x42e) {
                  uVar15 = 0x42f;
                }
                else if (iVar6 == 0x431) {
                  uVar15 = 0x433;
                }
                else {
                  if (iVar6 != 0x46d) goto LAB_00132a48;
                  uVar15 = 0x46e;
                }
              }
              else if (iVar6 == 0x46f) {
                uVar15 = 0x470;
              }
              else if (iVar6 == 0x540) {
                uVar15 = 0x541;
              }
              else {
                if (iVar6 != 0x5a0) goto LAB_00132a48;
                uVar15 = 0x5a1;
              }
              *(undefined4 *)&first[1].field_0 = uVar15;
            }
          }
          first->_passData = (void *)0x0;
          if ((first->field_1)._any._nodeType == '\x11') {
            lVar16 = *plVar9;
            bVar20 = BaseRAPass::isNextTo
                               (&this->super_BaseRAPass,first,
                                &((this->super_BaseRAPass)._func)->_exitNode->super_BaseNode);
            if (!bVar20) {
              ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
                   (first->field_0).field_0._prev;
              local_3c = ((this->super_BaseRAPass)._func)->_exitNode->_labelId;
              local_40 = 4;
              local_38 = 0;
              EVar14 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                                 (this,&local_40);
              if (EVar14 != 0) {
                return EVar14;
              }
            }
            pBVar12 = (first->field_0).field_0._prev;
            BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
            *(BaseNode **)(lVar16 + 0x18) = pBVar12;
          }
        }
        if (bVar2 != 0) {
          pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
          lVar16 = 0;
          do {
            uVar5 = *(uint *)((long)&first[1].field_1 + lVar16);
            if ((uVar5 & 0x2007) == 0x2002) {
              uVar17 = *(int *)((long)&first[1]._position + lVar16) - 0x100;
              if (uVar4 <= uVar17) {
                return 0x1f;
              }
              uVar19._0_1_ = pBVar7[1].super_BaseEmitter._environment._arch;
              uVar19._1_1_ = pBVar7[1].super_BaseEmitter._environment._subArch;
              uVar19._2_1_ = pBVar7[1].super_BaseEmitter._environment._vendor;
              uVar19._3_1_ = pBVar7[1].super_BaseEmitter._environment._platform;
              if (uVar17 < uVar19) {
                p_Var10 = pBVar7[1].super_BaseEmitter._errorHandler[uVar17]._vptr_ErrorHandler[4];
                if (p_Var10 != (_func_int *)0x0) {
                  pbVar11 = *(byte **)(p_Var10 + 0x18);
                  iVar6 = *(int *)(pbVar11 + 0x10);
                  uVar17 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature;
                  *(uint *)((long)&first[1]._position + lVar16) = (uint)*pbVar11;
                  *(uint *)((long)&first[1].field_1 + lVar16) = uVar5 & 0xffffdf02 | uVar17 & 0xf8;
                  piVar1 = (int *)((long)&first[1].field_3 + lVar16 + 4);
                  *piVar1 = *piVar1 + iVar6;
                  goto LAB_0013296c;
                }
              }
              else {
                _rewrite();
              }
              _rewrite();
              goto LAB_00132a48;
            }
LAB_0013296c:
            lVar16 = lVar16 + 0x10;
          } while ((ulong)bVar2 * 0x10 != lVar16);
        }
      }
      first = pBVar8;
    } while (pBVar8 != stop);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // If the instruction contains pass data (raInst) then it was a subject
        // for register allocation and must be rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            // Transform VEX instruction to EVEX.
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // This data is allocated by Zone passed to `runOnFunction()`, which
        // will be reset after the RA pass finishes. So reset this data to
        // prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        if (ASMJIT_UNLIKELY(node->type() != BaseNode::kNodeInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit
          // label is next to it (optimization) or patched to an architecture
          // dependent jump instruction that jumps to the function's exit before
          // the epilog.
          if (node->type() == BaseNode::kNodeFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

    node = next;
  }

  return kErrorOk;
}